

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_tmpnam(char *suffix,char *rootname,char *tmpnam)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int local_28;
  int ii;
  int maxtry;
  char *tmpnam_local;
  char *rootname_local;
  char *suffix_local;
  
  sVar3 = strlen(suffix);
  sVar4 = strlen(rootname);
  if (0x1fc < sVar3 + sVar4) {
    fp_msg("Error: filename is too long to create temporary file\n");
    exit(-1);
  }
  strcpy(tmpnam,rootname);
  strcat(tmpnam,suffix);
  sVar3 = strlen(tmpnam);
  iVar1 = 0x200 - (int)sVar3;
  local_28 = 0;
  while ((local_28 < iVar1 && (iVar2 = fp_access(tmpnam), iVar2 == 0))) {
    sVar3 = strlen(tmpnam);
    if (0x1ff < sVar3) {
      fp_msg("\nCould not create temporary file name:\n");
      fp_msg(tmpnam);
      fp_msg("\n");
      exit(-1);
    }
    strcat(tmpnam,"x");
    local_28 = local_28 + 1;
  }
  if (local_28 != iVar1) {
    return 0;
  }
  fp_msg("\nCould not create temporary file name:\n");
  fp_msg(tmpnam);
  fp_msg("\n");
  exit(-1);
}

Assistant:

int fp_tmpnam(char *suffix, char *rootname, char *tmpnam)
{
	/* create temporary file name */

	int maxtry = 30, ii;

	if (strlen(suffix) + strlen(rootname) > SZ_STR-5) {
	    fp_msg ("Error: filename is too long to create temporary file\n"); exit (-1);
	}

	strcpy (tmpnam, rootname);  /* start with rootname */
	strcat(tmpnam, suffix);     /* append the suffix */

	maxtry = SZ_STR - strlen(tmpnam) - 1;

        for (ii = 0; ii < maxtry; ii++) {
		if (fp_access(tmpnam)) break;  /* good, the file does not exist */
                if (strlen(tmpnam) > SZ_STR-2)
                {
		   fp_msg ("\nCould not create temporary file name:\n");
		   fp_msg (tmpnam);
		   fp_msg ("\n");
		   exit (-1);
                }
		strcat(tmpnam, "x");  /* append an x to the name, and try again */
	}

	if (ii == maxtry) {
		fp_msg ("\nCould not create temporary file name:\n");
		fp_msg (tmpnam);
		fp_msg ("\n");
		exit (-1);
	}

        return(0);
}